

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fRasterizationTests.cpp
# Opt level: O2

void __thiscall
deqp::gles3::Functional::anon_unknown_1::FillRuleCase::FillRuleCase
          (FillRuleCase *this,Context *ctx,char *name,char *desc,FillRuleCaseType type,
          RenderTarget renderTarget,int numSamples)

{
  int iVar1;
  int renderSize;
  bool bVar2;
  
  (this->super_BaseRenderingCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__FillRuleCase_01e21d68;
  bVar2 = ((uint)desc & 0xfffffffe) == 2;
  renderSize = 0x100;
  if (bVar2) {
    renderSize = 0x40;
  }
  iVar1 = 2;
  if (bVar2) {
    iVar1 = 0xf;
  }
  BaseRenderingCase::BaseRenderingCase
            (&this->super_BaseRenderingCase,ctx,name,"Verify fill rules",type,renderTarget,
             renderSize);
  (this->super_BaseRenderingCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__FillRuleCase_01e21d68;
  *(uint *)&(this->super_BaseRenderingCase).field_0xc4 = (uint)desc;
  this->m_iteration = 0;
  this->m_iterationCount = iVar1;
  this->m_allIterationsPassed = true;
  return;
}

Assistant:

FillRuleCase::FillRuleCase (Context& ctx, const char* name, const char* desc, FillRuleCaseType type, RenderTarget renderTarget, int numSamples)
	: BaseRenderingCase		(ctx, name, desc, renderTarget, numSamples, getRenderSize(type))
	, m_caseType			(type)
	, m_iteration			(0)
	, m_iterationCount		(getNumIterations(type))
	, m_allIterationsPassed	(true)
{
	DE_ASSERT(type < FILLRULECASE_LAST);
}